

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::RePost(cmCursesMainForm *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  FIELD **ppFVar5;
  cmState *pcVar6;
  char *pcVar7;
  reference ppcVar8;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  undefined1 local_10a;
  allocator local_109;
  undefined1 local_108 [6];
  bool advanced_1;
  char *local_e8;
  char *existingValue_1;
  cmCursesCacheEntryComposite **local_d8;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  local_d0;
  iterator it;
  ulong uStack_c0;
  int j;
  size_t cc;
  string local_b0;
  allocator local_89;
  string local_88;
  undefined1 local_65;
  bool advanced;
  allocator local_51;
  string local_50;
  char *local_30;
  char *existingValue;
  cmCursesCacheEntryComposite **local_20;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  local_18;
  iterator it_1;
  cmCursesMainForm *this_local;
  
  it_1._M_current = (cmCursesCacheEntryComposite **)this;
  if ((this->super_cmCursesForm).Form != (FORM *)0x0) {
    unpost_form((FORM_conflict *)(this->super_cmCursesForm).Form);
    free_form((FORM_conflict *)(this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  if (this->Fields != (FIELD **)0x0) {
    operator_delete__(this->Fields);
  }
  if ((this->AdvancedMode & 1U) == 0) {
    this->NumberOfVisibleEntries = 0;
    __gnu_cxx::
    __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
    ::__normal_iterator(&local_18);
    local_20 = (cmCursesCacheEntryComposite **)
               std::
               vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               ::begin(this->Entries);
    local_18._M_current = local_20;
    while( true ) {
      existingValue =
           (char *)std::
                   vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                   ::end(this->Entries);
      bVar2 = __gnu_cxx::operator!=
                        (&local_18,
                         (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                          *)&existingValue);
      if (!bVar2) break;
      pcVar6 = cmake::GetState(this->CMakeInstance);
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                ::operator*(&local_18);
      pcVar7 = cmCursesCacheEntryComposite::GetValue(*ppcVar8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_50,pcVar7,&local_51);
      pcVar7 = cmState::GetCacheEntryValue(pcVar6,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      local_30 = pcVar7;
      pcVar6 = cmake::GetState(this->CMakeInstance);
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                ::operator*(&local_18);
      pcVar7 = cmCursesCacheEntryComposite::GetValue(*ppcVar8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_88,pcVar7,&local_89);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b0,"ADVANCED",(allocator *)((long)&cc + 7));
      bVar2 = cmState::GetCacheEntryPropertyAsBool(pcVar6,&local_88,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cc + 7));
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      if ((local_30 != (char *)0x0) && (((this->AdvancedMode & 1U) != 0 || (!bVar2)))) {
        this->NumberOfVisibleEntries = this->NumberOfVisibleEntries + 1;
      }
      local_65 = bVar2;
      __gnu_cxx::
      __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
      ::operator++(&local_18);
    }
  }
  else {
    sVar3 = std::
            vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
            size(this->Entries);
    this->NumberOfVisibleEntries = sVar3;
  }
  if (this->NumberOfVisibleEntries == 0) {
    this->NumberOfVisibleEntries = 1;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->NumberOfVisibleEntries * 3 + 1;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  ppFVar5 = (FIELD **)operator_new__(uVar4);
  this->Fields = ppFVar5;
  for (uStack_c0 = 0; uStack_c0 < this->NumberOfVisibleEntries * 3 + 1; uStack_c0 = uStack_c0 + 1) {
    this->Fields[uStack_c0] = (FIELD *)0x0;
  }
  it._M_current._4_4_ = 0;
  __gnu_cxx::
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  ::__normal_iterator(&local_d0);
  local_d8 = (cmCursesCacheEntryComposite **)
             std::
             vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
             begin(this->Entries);
  local_d0._M_current = local_d8;
  while( true ) {
    existingValue_1 =
         (char *)std::
                 vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 ::end(this->Entries);
    bVar2 = __gnu_cxx::operator!=
                      (&local_d0,
                       (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                        *)&existingValue_1);
    if (!bVar2) break;
    pcVar6 = cmake::GetState(this->CMakeInstance);
    ppcVar8 = __gnu_cxx::
              __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
              ::operator*(&local_d0);
    pcVar7 = cmCursesCacheEntryComposite::GetValue(*ppcVar8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_108,pcVar7,&local_109);
    pcVar7 = cmState::GetCacheEntryValue(pcVar6,(string *)local_108);
    std::__cxx11::string::~string((string *)local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    local_e8 = pcVar7;
    pcVar6 = cmake::GetState(this->CMakeInstance);
    ppcVar8 = __gnu_cxx::
              __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
              ::operator*(&local_d0);
    pcVar7 = cmCursesCacheEntryComposite::GetValue(*ppcVar8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,pcVar7,&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,"ADVANCED",&local_159);
    bVar2 = cmState::GetCacheEntryPropertyAsBool(pcVar6,&local_130,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    local_10a = bVar2;
    if ((local_e8 != (char *)0x0) && (((this->AdvancedMode & 1U) != 0 || (!bVar2)))) {
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                ::operator*(&local_d0);
      this->Fields[it._M_current._4_4_ * 3] = ((*ppcVar8)->Label->super_cmCursesWidget).Field;
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                ::operator*(&local_d0);
      this->Fields[it._M_current._4_4_ * 3 + 1] =
           ((*ppcVar8)->IsNewLabel->super_cmCursesWidget).Field;
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                ::operator*(&local_d0);
      this->Fields[it._M_current._4_4_ * 3 + 2] = (*ppcVar8)->Entry->Field;
      it._M_current._4_4_ = it._M_current._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
    ::operator++(&local_d0);
  }
  if (it._M_current._4_4_ == 0) {
    local_d0._M_current =
         (cmCursesCacheEntryComposite **)
         std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
         ::begin(this->Entries);
    ppcVar8 = __gnu_cxx::
              __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
              ::operator*(&local_d0);
    *this->Fields = ((*ppcVar8)->Label->super_cmCursesWidget).Field;
    ppcVar8 = __gnu_cxx::
              __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
              ::operator*(&local_d0);
    this->Fields[1] = ((*ppcVar8)->IsNewLabel->super_cmCursesWidget).Field;
    ppcVar8 = __gnu_cxx::
              __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
              ::operator*(&local_d0);
    this->Fields[2] = (*ppcVar8)->Entry->Field;
    this->NumberOfVisibleEntries = 1;
  }
  this->Fields[this->NumberOfVisibleEntries * 3] = (FIELD *)0x0;
  return;
}

Assistant:

void cmCursesMainForm::RePost()
{
  // Create the fields to be passed to the form.
  if (this->Form)
    {
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = 0;
    }
  delete[] this->Fields;
  if (this->AdvancedMode)
    {
    this->NumberOfVisibleEntries = this->Entries->size();
    }
  else
    {
    // If normal mode, count only non-advanced entries
    this->NumberOfVisibleEntries = 0;
    std::vector<cmCursesCacheEntryComposite*>::iterator it;
    for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
      {
      const char* existingValue =
          this->CMakeInstance->GetState()
              ->GetCacheEntryValue((*it)->GetValue());
      bool advanced =
          this->CMakeInstance->GetState()
              ->GetCacheEntryPropertyAsBool((*it)->GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced))
        {
        continue;
        }
      this->NumberOfVisibleEntries++;
      }
    }
  // there is always one even if it is the dummy one
  if(this->NumberOfVisibleEntries == 0)
    {
    this->NumberOfVisibleEntries = 1;
    }
  // Assign the fields: 3 for each entry: label, new entry marker
  // ('*' or ' ') and entry widget
  this->Fields = new FIELD*[3*this->NumberOfVisibleEntries+1];
  size_t cc;
  for ( cc = 0; cc < 3 * this->NumberOfVisibleEntries+1; cc ++ )
    {
    this->Fields[cc] = 0;
    }

  // Assign fields
  int j=0;
  std::vector<cmCursesCacheEntryComposite*>::iterator it;
  for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
    {
    const char* existingValue =
        this->CMakeInstance->GetState()
            ->GetCacheEntryValue((*it)->GetValue());
    bool advanced =
        this->CMakeInstance->GetState()
            ->GetCacheEntryPropertyAsBool((*it)->GetValue(), "ADVANCED");
    if (!existingValue || (!this->AdvancedMode && advanced))
      {
      continue;
      }
    this->Fields[3*j]    = (*it)->Label->Field;
    this->Fields[3*j+1]  = (*it)->IsNewLabel->Field;
    this->Fields[3*j+2]  = (*it)->Entry->Field;
    j++;
    }
  // if no cache entries there should still be one dummy field
  if(j == 0)
    {
    it = this->Entries->begin();
    this->Fields[0]    = (*it)->Label->Field;
    this->Fields[1]  = (*it)->IsNewLabel->Field;
    this->Fields[2]  = (*it)->Entry->Field;
    this->NumberOfVisibleEntries = 1;
    }
  // Has to be null terminated.
  this->Fields[3*this->NumberOfVisibleEntries] = 0;
}